

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirFPOS(void)

{
  int iVar1;
  int local_10;
  int local_c;
  int method;
  aint val;
  
  local_10 = 0;
  SkipBlanks(&lp);
  if ((*lp == '+') || (*lp == '-')) {
    local_10 = 1;
  }
  iVar1 = ParseExpressionNoSyntaxError(&lp,&local_c);
  if (iVar1 == 0) {
    Error("[FPOS] Syntax error",lp,SUPPRESS);
  }
  else if (pass == 3) {
    SeekDest((long)local_c,local_10);
  }
  return;
}

Assistant:

static void dirFPOS() {
	aint val;
	int method = SEEK_SET;
	SkipBlanks(lp);
	if ((*lp == '+') || (*lp == '-')) {
		method = SEEK_CUR;
	}
	if (!ParseExpressionNoSyntaxError(lp, val)) {
		Error("[FPOS] Syntax error", lp, SUPPRESS);
	} else if (pass == LASTPASS) {
		SeekDest(val, method);
	}
}